

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_features.pb.cc
# Opt level: O0

void pb::CppFeatures::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  CppFeatures **v1;
  CppFeatures **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  CppFeatures *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CppFeatures *from;
  CppFeatures *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (CppFeatures *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (CppFeatures *)to_msg;
  _this = (CppFeatures *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<pb::CppFeatures_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<pb::CppFeatures*>(&from);
  local_30 = absl::lts_20250127::log_internal::Check_NEImpl<pb::CppFeatures_const*,pb::CppFeatures*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar3;
    if ((uVar1 & 7) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.string_type_ = *(int *)(absl_log_internal_check_op_result + 0x18);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.legacy_closed_enum_ =
             (bool)(absl_log_internal_check_op_result[0x1c] & 1);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.enum_name_uses_string_view_ =
             (bool)(absl_log_internal_check_op_result[0x1d] & 1);
      }
    }
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/cpp_features.pb.cc"
             ,0x172,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void CppFeatures::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<CppFeatures*>(&to_msg);
  auto& from = static_cast<const CppFeatures&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:pb.CppFeatures)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.string_type_ = from._impl_.string_type_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.legacy_closed_enum_ = from._impl_.legacy_closed_enum_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.enum_name_uses_string_view_ = from._impl_.enum_name_uses_string_view_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}